

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O0

void __thiscall mocker::LexError::~LexError(LexError *this)

{
  LexError *this_local;
  
  ~LexError(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

LexError(Position beg, Position end) : CompileError(beg, end) {}